

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_heap_allocator.h
# Opt level: O2

void __thiscall
tcmalloc::PageHeapAllocator<tcmalloc::StackTrace>::Init
          (PageHeapAllocator<tcmalloc::StackTrace> *this)

{
  StackTrace *pSVar1;
  
  *(undefined8 *)((long)&this->free_avail_ + 4) = 0;
  *(undefined8 *)((long)&this->free_list_ + 4) = 0;
  this->free_area_ = (char *)0x0;
  this->free_avail_ = 0;
  pSVar1 = New(this);
  pSVar1->size = (uintptr_t)this->free_list_;
  this->free_list_ = pSVar1;
  this->inuse_ = this->inuse_ + -1;
  return;
}

Assistant:

void Init() {
    ASSERT(sizeof(T) <= kAllocIncrement);
    inuse_ = 0;
    free_area_ = nullptr;
    free_avail_ = 0;
    free_list_ = nullptr;
    // Reserve some space at the beginning to avoid fragmentation.
    Delete(New());
  }